

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

HelicsEndpoint
helicsFederateRegisterGlobalEndpoint(HelicsFederate fed,char *name,char *type,HelicsError *err)

{
  size_t sVar1;
  size_t sVar2;
  Endpoint *pEVar3;
  FedObject *pFVar4;
  HelicsEndpoint pvVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  string_view eptName;
  string_view type_00;
  __single_object end;
  shared_ptr<helics::MessageFederate> fedObj;
  _Head_base<0UL,_helics::EndpointObject_*,_false> local_50;
  __uniq_ptr_impl<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> local_48;
  __shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  getMessageFedSharedPtr(&local_40,(HelicsError *)fed);
  if (local_40._M_ptr == (MessageFederate *)0x0) {
    pvVar5 = (HelicsEndpoint)0x0;
  }
  else {
    std::make_unique<helics::EndpointObject>();
    sVar1 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var6 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar1 = strlen(name);
      _Var6._M_p = name;
    }
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var7._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (type != (char *)0x0) {
      sVar2 = strlen(type);
      _Var7._M_p = type;
    }
    eptName._M_str = _Var6._M_p;
    eptName._M_len = sVar1;
    type_00._M_str = _Var7._M_p;
    type_00._M_len = sVar2;
    pEVar3 = helics::MessageFederate::registerGlobalEndpoint(local_40._M_ptr,eptName,type_00);
    (local_50._M_head_impl)->endPtr = pEVar3;
    std::__shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((local_50._M_head_impl)->fedptr).
                super___shared_ptr<helics::MessageFederate,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    pFVar4 = helics::getFedObject(fed,(HelicsError *)0x0);
    (local_50._M_head_impl)->fed = pFVar4;
    local_48._M_t.
    super__Tuple_impl<0UL,_helics::EndpointObject_*,_std::default_delete<helics::EndpointObject>_>.
    super__Head_base<0UL,_helics::EndpointObject_*,_false>._M_head_impl =
         (tuple<helics::EndpointObject_*,_std::default_delete<helics::EndpointObject>_>)
         (tuple<helics::EndpointObject_*,_std::default_delete<helics::EndpointObject>_>)
         local_50._M_head_impl;
    local_50._M_head_impl = (EndpointObject *)0x0;
    pvVar5 = anon_unknown.dwarf_8bada::addEndpoint
                       (fed,(unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                             *)&local_48);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
                &local_48);
    std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
    ~unique_ptr((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_> *)
                &local_50);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return pvVar5;
}

Assistant:

HelicsEndpoint helicsFederateRegisterGlobalEndpoint(HelicsFederate fed, const char* name, const char* type, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto end = std::make_unique<helics::EndpointObject>();
        end->endPtr = &fedObj->registerGlobalEndpoint(AS_STRING_VIEW(name), AS_STRING_VIEW(type));
        end->fedptr = std::move(fedObj);
        end->fed = helics::getFedObject(fed, nullptr);
        return addEndpoint(fed, std::move(end));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}